

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<int_*,_bool> __thiscall
HighsHashTree<int,_int>::InnerLeaf<2>::insert_entry
          (InnerLeaf<2> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  unsigned_long *puVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  undefined8 uVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  pair<int_*,_bool> pVar13;
  uint local_24;
  
  uVar12 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar5 = (byte)(uVar12 >> 10);
  uVar4 = (this->occupation).occupation;
  uVar7 = POPCOUNT(uVar4 >> (bVar5 & 0x3f));
  local_24 = (uint)uVar7;
  if ((uVar4 >> (uVar12 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar4 | 1L << (bVar5 & 0x3f);
    uVar8 = this->size;
    if ((int)local_24 < (int)uVar8) {
      puVar11 = (this->hashes)._M_elems + uVar7;
      uVar7 = (ulong)(local_24 - 1);
      do {
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar4 = *puVar11;
        puVar11 = puVar11 + 1;
      } while ((uVar12 & 0xffff) < uVar4);
      goto LAB_00272c62;
    }
  }
  else {
    lVar2 = uVar7 - 2;
    uVar7 = (ulong)(local_24 - 2);
    puVar11 = (this->hashes)._M_elems + lVar2;
    do {
      puVar10 = puVar11 + 1;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      puVar1 = puVar11 + 1;
      puVar11 = puVar10;
    } while ((uVar12 & 0xffff) < *puVar1);
    uVar8 = this->size;
    if (uVar8 == uVar6) goto LAB_00272c82;
    do {
      if (*puVar10 != (uVar12 & 0xffff)) goto LAB_00272c62;
      if (entry->key_ == (int)puVar10[0x17]) {
        puVar11 = (this->hashes)._M_elems + (long)(int)uVar7 + -2;
        uVar9 = 0;
        goto LAB_00272cb6;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      puVar10 = puVar10 + 1;
    } while (uVar8 != uVar6);
    uVar7 = (ulong)uVar8;
LAB_00272c62:
    local_24 = (uint)uVar7;
  }
  uVar6 = (uint)uVar7;
  if ((int)(uint)uVar7 < (int)uVar8) {
    move_backward(this,(int *)&local_24,&this->size);
    uVar6 = local_24;
  }
LAB_00272c82:
  puVar11 = (this->hashes)._M_elems + (long)(int)uVar6 + -2;
  *(Entry *)(puVar11 + 0x19) = *entry;
  puVar11[2] = uVar12 & 0xffff;
  iVar3 = this->size;
  lVar2 = (long)iVar3 + 1;
  this->size = (int)lVar2;
  (this->hashes)._M_elems[(long)iVar3 + 1] = 0;
  uVar9 = CONCAT71((int7)((ulong)lVar2 >> 8),1);
LAB_00272cb6:
  pVar13.first = (int *)((long)puVar11 + 0xcc);
  pVar13._8_8_ = uVar9;
  return pVar13;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }